

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  long lVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *this;
  ImDrawVert *pIVar3;
  ImDrawIdx *pIVar4;
  ImVec2 p_max;
  ImVec2 p_max_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ImGuiContext *pIVar11;
  undefined4 uVar12;
  bool bVar13;
  uint uVar14;
  ImU32 col_upr_right;
  ImU32 col_00;
  ulong uVar15;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar16;
  ImVec2 *__dest;
  int iVar17;
  ImVec2 *pIVar18;
  char *text_end;
  uint uVar19;
  long lVar20;
  int iVar21;
  ImGuiContext *g;
  ImGuiContext *pIVar22;
  ImVec2 IVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ImVec2 pos_00;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  float fVar30;
  undefined4 extraout_XMM0_Dc;
  undefined1 extraout_var_01 [12];
  float fVar31;
  undefined4 extraout_XMM0_Dd;
  float fVar32;
  float fVar33;
  ImVec2 p_max_01;
  ImVec2 p_max_02;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [16];
  float fVar37;
  ImVec2 IVar38;
  ImVec2 IVar39;
  float fVar40;
  undefined1 auVar41 [16];
  ImVec2 picker_pos;
  ImVec2 wheel_center;
  ImGuiContext *g_1;
  ImVec4 hue_color_f;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  ImVec4 ref_col_v4;
  ImVec2 tra;
  ImVec2 sv_cursor_pos;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  byte local_234;
  byte local_230;
  ImVec2 local_228;
  ImVec2 local_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  undefined1 local_208 [8];
  uint uStack_200;
  uint uStack_1fc;
  float local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  ImGuiContext *local_1e0;
  ImVec4 local_1d8;
  undefined1 local_1c8 [16];
  float local_1ac;
  ImVec2 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined1 local_188 [16];
  ImVec2 local_170;
  ImVec2 local_168;
  ImVec2 local_160;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  char *local_148;
  uint local_13c;
  undefined1 local_138 [16];
  undefined1 local_120 [12];
  float fStack_114;
  ImVec2 *local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_cc;
  undefined1 local_c8 [16];
  size_t local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58 [3];
  undefined1 auStack_4c [12];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar22 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  uStack_210 = local_218;
  local_218 = (undefined1  [8])pIVar2;
  this = pIVar2->DrawList;
  local_1a8 = (ImVec2)ref_col;
  local_148 = label;
  local_110 = (ImVec2 *)col;
  PushID(label);
  BeginGroup();
  uVar19 = (uint)~flags >> 4 & 0x10;
  if (((flags & 8U) == 0) && ((flags & 0x6000000U) == 0 || (flags & 0x10002U) == 0)) {
    bVar13 = BeginPopup("context",0);
    if (bVar13) {
      local_1e0 = GImGui;
      if ((flags & 0x6000000U) == 0) {
        local_c8._0_8_ = pIVar22;
        local_1d8.x = GImGui->FontSize * 8.0;
        fVar27 = (GImGui->Style).FramePadding.y;
        local_1d8.y = local_1d8.x -
                      (fVar27 + fVar27 + GImGui->FontSize + (GImGui->Style).ItemInnerSpacing.x);
        if (local_1d8.y <= 1.0) {
          local_1d8.y = 1.0;
        }
        local_208._0_4_ = flags & 2;
        PushItemWidth(local_1d8.x);
        iVar21 = 0;
        local_1c8._0_4_ = uVar19;
        do {
          if (iVar21 == 1) {
            Separator();
          }
          PushID(iVar21);
          uVar19 = (uint)(iVar21 == 1) * 0x4000000 +
                   (uint)(iVar21 == 0) * 0x2000000 + local_208._0_4_ + 0x1a8;
          IVar23 = (GImGui->CurrentWindow->DC).CursorPos;
          bVar13 = Selectable("##selectable",false,0,(ImVec2 *)&local_1d8);
          if (bVar13) {
            local_1e0->ColorEditOptions =
                 uVar19 & 0x6000000 | local_1e0->ColorEditOptions & 0xf9ffffffU;
          }
          pIVar2 = GImGui->CurrentWindow;
          pIVar2->WriteAccessed = true;
          (pIVar2->DC).CursorPos = IVar23;
          fVar27 = (pIVar2->DC).CursorMaxPos.x;
          fVar26 = (pIVar2->DC).CursorMaxPos.y;
          fVar32 = (pIVar2->DC).CursorPos.x;
          fVar40 = (pIVar2->DC).CursorPos.y;
          uVar24 = -(uint)(fVar32 <= fVar27);
          IVar23.x = (float)(~uVar24 & (uint)fVar32 | (uint)fVar27 & uVar24);
          uVar24 = -(uint)(fVar40 <= fVar26);
          IVar23.y = (float)(~uVar24 & (uint)fVar40 | (uint)fVar26 & uVar24);
          (pIVar2->DC).CursorMaxPos = IVar23;
          uVar15 = (ulong)((uVar19 & 2) == 0);
          memset(auStack_4c + uVar15 * 4,0,(ulong)((uVar19 & 2) * 2));
          memcpy(local_58,local_110,uVar15 * 4 + 0xc);
          ColorPicker4("##dummypicker",local_58,uVar19,(float *)0x0);
          PopID();
          iVar21 = iVar21 + 1;
          uVar19 = local_1c8._0_4_;
        } while (iVar21 == 1);
        PopItemWidth();
        pIVar22 = (ImGuiContext *)local_c8._0_8_;
      }
      if ((flags & 0x10002U) == 0) {
        if ((flags & 0x6000000U) == 0) {
          Separator();
        }
        CheckboxFlags("Alpha Bar",(uint *)&local_1e0->ColorEditOptions,0x10000);
      }
      EndPopup();
    }
  }
  uVar19 = uVar19 | flags;
  if ((flags & 0x6000000U) == 0) {
    uVar14 = pIVar22->ColorEditOptions & 0x6000000;
    uVar24 = 0x2000000;
    if (uVar14 != 0) {
      uVar24 = uVar14;
    }
    uVar19 = uVar19 | uVar24;
  }
  uVar24 = (uVar19 & 0x6000000) - 1;
  if ((uVar19 & 0x6000000 ^ uVar24) <= uVar24) {
    __assert_fail("ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2f9b,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar19 & 8) == 0) {
    uVar19 = uVar19 | pIVar22->ColorEditOptions & 0x10000U;
  }
  uVar24 = uVar19 & 0x10002;
  local_228 = *(ImVec2 *)((long)local_218 + 200);
  fVar27 = (GImGui->Style).FramePadding.y;
  local_188 = ZEXT416((uint)(fVar27 + fVar27 + GImGui->FontSize));
  fVar26 = CalcItemWidth();
  pIVar18 = local_110;
  fVar27 = (pIVar22->Style).ItemInnerSpacing.x;
  local_138 = ZEXT416((uint)fVar27);
  fVar26 = fVar26 - ((float)local_188._0_4_ + fVar27) * (float)(byte)((uVar24 == 0x10000) + 1);
  uVar14 = -(uint)(fVar26 <= (float)local_188._0_4_);
  uStack_1f4 = extraout_var_01._0_4_ & local_188._4_4_;
  uStack_1f0 = extraout_var_01._4_4_ & local_188._8_4_;
  uStack_1ec = extraout_var_01._8_4_ & local_188._12_4_;
  local_1f8 = (float)(~uVar14 & (uint)fVar26 | uVar14 & local_188._0_4_);
  local_218._0_4_ = local_228.x;
  fVar27 = local_228.x + local_1f8 + fVar27;
  local_1c8 = ZEXT416((uint)fVar27);
  local_208._4_4_ = local_188._4_4_;
  local_208._0_4_ = (float)local_188._0_4_ + fVar27;
  uStack_200 = local_188._8_4_;
  uStack_1fc = local_188._12_4_;
  local_b0 = (ulong)((uVar19 & 2) == 0) * 4 + 0xc;
  memcpy(local_58,local_110,local_b0);
  local_98 = local_1f8 * 0.5;
  local_1e0 = (ImGuiContext *)CONCAT44(local_1e0._4_4_,local_1f8 * 0.08);
  local_160.x = local_98 - local_1f8 * 0.08;
  local_220.x = ((float)local_188._0_4_ + local_1f8) * 0.5 + (float)local_218._0_4_;
  uStack_94 = uStack_1f4;
  uStack_90 = uStack_1f0;
  uStack_8c = uStack_1ec;
  local_220.y = local_228.y + local_98;
  local_218._4_4_ = uStack_1f4;
  local_218._0_4_ = local_160.x;
  uStack_210._0_4_ = uStack_1f0;
  uStack_210._4_4_ = uStack_1ec;
  local_160.x = local_160.x - (float)(int)(local_1f8 * 0.027);
  local_160.y = 0.0;
  local_170.x = local_160.x * -0.5;
  local_1ac = local_160.x * -0.866025;
  uStack_74 = uStack_1f4;
  uStack_70 = uStack_1f0;
  uStack_6c = uStack_1ec;
  local_170.y = local_160.x * 0.866025;
  local_c8._0_4_ = local_170.x;
  fVar27 = pIVar18->x;
  fVar26 = pIVar18->y;
  fVar32 = pIVar18[1].x;
  fVar40 = fVar26;
  fVar37 = fVar32;
  if (fVar32 <= fVar26) {
    fVar40 = fVar32;
    fVar37 = fVar26;
  }
  fVar32 = (float)(-(uint)(fVar26 < fVar32) & 0xbf800000);
  fVar26 = fVar37;
  if (fVar37 <= fVar27) {
    fVar26 = fVar27;
  }
  local_e8 = ZEXT416((uint)fVar26);
  fVar33 = fVar27;
  if (fVar37 <= fVar27) {
    fVar33 = fVar37;
  }
  fVar30 = fVar33;
  if (fVar40 <= fVar33) {
    fVar30 = fVar40;
  }
  local_f8 = ZEXT416((uint)((fVar26 - fVar30) / (fVar26 + 1e-20)));
  _local_158 = ZEXT416((uint)ABS((fVar33 - fVar40) / ((fVar26 - fVar30) * 6.0 + 1e-20) +
                                 (float)(-(uint)(fVar27 < fVar37) & (uint)(-0.33333334 - fVar32) |
                                        ~-(uint)(fVar27 < fVar37) & (uint)fVar32)));
  local_168.x = local_170.x;
  local_168.y = local_1ac;
  local_78 = local_160.x;
  local_68 = local_170.y;
  PushItemFlag(8,true);
  if ((uVar19 >> 0x1a & 1) == 0) {
    if ((uVar19 >> 0x19 & 1) != 0) {
      local_1d8.y = local_1f8;
      local_1d8.x = local_1f8;
      InvisibleButton("sv",(ImVec2 *)&local_1d8);
      IVar23 = local_1a8;
      if ((GImGui->ActiveId == 0) || (GImGui->ActiveId != (GImGui->CurrentWindow->DC).LastItemId)) {
        auVar7._12_4_ = 0;
        auVar7._0_12_ = stack0xfffffffffffffe6c;
        _local_198 = auVar7 << 0x20;
      }
      else {
        fVar32 = ((pIVar22->IO).MousePos.x - local_228.x) / (local_1f8 + -1.0);
        auVar34 = ZEXT812(0x3f800000);
        fVar26 = ((pIVar22->IO).MousePos.y - local_228.y) / (local_1f8 + -1.0);
        fVar27 = 1.0;
        if (fVar26 <= 1.0) {
          fVar27 = fVar26;
        }
        if (fVar32 <= 1.0) {
          auVar34._4_8_ = 0;
          auVar34._0_4_ = fVar32;
        }
        local_f8._4_4_ = 0;
        local_f8._0_4_ = ~-(uint)(fVar32 < 0.0) & auVar34._0_4_;
        local_f8._8_4_ = auVar34._8_4_;
        local_f8._12_4_ = 0;
        local_e8._8_8_ = 0;
        local_e8._0_8_ =
             (ulong)-(uint)(fVar26 < 0.0) & 0xffffffff3f800000 |
             (ulong)(~-(uint)(fVar26 < 0.0) & (uint)(1.0 - fVar27));
        local_198._0_4_ = (int)CONCAT71((int7)((ulong)GImGui->CurrentWindow >> 8),1);
      }
      if ((uVar19 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      pIVar2 = GImGui->CurrentWindow;
      pIVar2->WriteAccessed = true;
      (pIVar2->DC).CursorPos.x = (float)local_1c8._0_4_;
      (pIVar2->DC).CursorPos.y = local_228.y;
      fVar27 = (pIVar2->DC).CursorMaxPos.x;
      fVar26 = (pIVar2->DC).CursorMaxPos.y;
      uVar14 = -(uint)((float)local_1c8._0_4_ <= fVar27);
      fVar32 = (pIVar2->DC).CursorPos.y;
      uVar25 = -(uint)(fVar32 <= fVar26);
      IVar38.y = (float)(~uVar25 & (uint)fVar32 | (uint)fVar26 & uVar25);
      IVar38.x = (float)(~uVar14 & local_1c8._0_4_ | (uint)fVar27 & uVar14);
      (pIVar2->DC).CursorMaxPos = IVar38;
      local_1d8.y = local_1f8;
      local_1d8.x = (float)local_188._0_4_;
      InvisibleButton("hue",(ImVec2 *)&local_1d8);
      if ((GImGui->ActiveId == 0) || (GImGui->ActiveId != (GImGui->CurrentWindow->DC).LastItemId)) {
        local_230 = 0;
        local_234 = local_198[0];
        goto LAB_00198fa7;
      }
      fVar27 = ((pIVar22->IO).MousePos.y - local_228.y) / (local_1f8 + -1.0);
      auVar28 = ZEXT812(0x3f800000);
      if (fVar27 <= 1.0) {
        auVar28._4_8_ = 0;
        auVar28._0_4_ = fVar27;
      }
      local_158._0_4_ = ~-(uint)(fVar27 < 0.0) & auVar28._0_4_;
      local_158._4_4_ = 0;
      fStack_150 = (float)auVar28._8_4_;
      fStack_14c = 0.0;
      local_230 = 1;
      local_234 = 1;
      goto LAB_00198fb4;
    }
    auVar5._12_4_ = 0;
    auVar5._0_12_ = stack0xfffffffffffffe6c;
    _local_198 = auVar5 << 0x20;
    local_230 = 0;
    local_234 = 0;
    IVar23 = local_1a8;
  }
  else {
    local_1d8.y = local_1f8;
    local_1d8.x = (pIVar22->Style).ItemInnerSpacing.x + local_1f8 + (float)local_188._0_4_;
    InvisibleButton("hsv",(ImVec2 *)&local_1d8);
    IVar23 = local_1a8;
    if (GImGui->ActiveId == 0) {
      auVar6._12_4_ = 0;
      auVar6._0_12_ = stack0xfffffffffffffe6c;
      _local_198 = auVar6 << 0x20;
      local_230 = 0;
      local_234 = 0;
    }
    else if (GImGui->ActiveId == (GImGui->CurrentWindow->DC).LastItemId) {
      fVar26 = (pIVar22->IO).MouseClickedPos[0].x - local_220.x;
      _local_198 = ZEXT416((uint)fVar26);
      fVar32 = (pIVar22->IO).MouseClickedPos[0].y - local_220.y;
      fVar27 = (pIVar22->IO).MousePos.x - local_220.x;
      local_88 = ZEXT416((uint)fVar27);
      local_cc = (pIVar22->IO).MousePos.y - local_220.y;
      fVar26 = fVar26 * fVar26 + fVar32 * fVar32;
      if ((fVar26 < ((float)local_218._0_4_ + -1.0) * ((float)local_218._0_4_ + -1.0)) ||
         ((local_98 + 1.0) * (local_98 + 1.0) < fVar26)) {
        local_230 = 0;
      }
      else {
        fVar27 = atan2f(local_cc,fVar27);
        fVar27 = (fVar27 / 3.1415927) * 0.5;
        _local_158 = ZEXT416(~-(uint)(fVar27 < 0.0) & (uint)fVar27 |
                             (uint)(fVar27 + 1.0) & -(uint)(fVar27 < 0.0));
        local_230 = 1;
      }
      local_a8 = (float)local_158._0_4_ * -2.0 * 3.1415927;
      fVar27 = cosf(local_a8);
      fVar26 = sinf(local_a8);
      local_1d8.x = (float)local_198._0_4_ * fVar27 - fVar26 * fVar32;
      local_1d8.y = (float)local_198._0_4_ * fVar26 + fVar32 * fVar27;
      bVar13 = ImTriangleContainsPoint(&local_160,&local_168,&local_170,(ImVec2 *)&local_1d8);
      if (bVar13) {
        local_1d8.x = (float)local_88._0_4_ * fVar27 - fVar26 * local_cc;
        local_1d8.y = (float)local_88._0_4_ * fVar26 + local_cc * fVar27;
        bVar13 = ImTriangleContainsPoint(&local_160,&local_168,&local_170,(ImVec2 *)&local_1d8);
        uVar16 = extraout_var;
        if (!bVar13) {
          local_1d8._0_8_ =
               ImTriangleClosestPoint(&local_160,&local_168,&local_170,(ImVec2 *)&local_1d8);
          IVar23 = local_1a8;
          uVar16 = extraout_var_00;
        }
        fVar26 = (float)local_c8._0_4_ - local_78;
        fVar27 = fVar26 * local_68 - local_1ac * fVar26;
        auVar29 = ZEXT812(0x3f800000);
        fVar32 = 1.0 - (local_68 * (local_1d8.x - local_78) - fVar26 * local_1d8.y) / fVar27;
        auVar35 = ZEXT812(0x3f800000);
        if (fVar32 <= 1.0) {
          auVar35._4_8_ = 0;
          auVar35._0_4_ = fVar32;
        }
        local_e8._0_4_ =
             -(uint)(fVar32 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar32 < 0.0001) & auVar35._0_4_;
        local_e8._4_4_ = 0;
        local_e8._8_4_ = auVar35._8_4_;
        local_e8._12_4_ = 0;
        fVar27 = (fVar32 - (fVar26 * local_1d8.y - (local_1d8.x - local_78) * local_1ac) / fVar27) /
                 (float)local_e8._0_4_;
        if (fVar27 <= 1.0) {
          auVar29._4_8_ = 0;
          auVar29._0_4_ = fVar27;
        }
        auVar36._0_4_ = ~-(uint)(fVar27 < 0.0001) & auVar29._0_4_;
        auVar36._4_4_ = 0;
        auVar36._8_4_ = auVar29._8_4_;
        auVar36._12_4_ = 0;
        auVar41._0_8_ = (ulong)-(uint)(fVar27 < 0.0001) & 0xffffffff38d1b717;
        auVar41._8_8_ = 0;
        local_f8 = auVar41 | auVar36;
        local_198._0_4_ = (int)CONCAT71(uVar16,1);
        local_234 = 1;
      }
      else {
        auVar9._12_4_ = 0;
        auVar9._0_12_ = stack0xfffffffffffffe6c;
        _local_198 = auVar9 << 0x20;
        local_234 = local_230;
      }
    }
    else {
      auVar8._12_4_ = 0;
      auVar8._0_12_ = stack0xfffffffffffffe6c;
      _local_198 = auVar8 << 0x20;
      local_230 = 0;
      local_234 = 0;
    }
    if ((uVar19 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
LAB_00198fa7:
LAB_00198fb4:
  }
  local_138._0_4_ = (float)local_138._0_4_ + (float)local_208._0_4_;
  if (uVar24 == 0x10000) {
    pIVar2 = GImGui->CurrentWindow;
    pIVar2->WriteAccessed = true;
    (pIVar2->DC).CursorPos.x = (float)local_138._0_4_;
    (pIVar2->DC).CursorPos.y = local_228.y;
    fVar27 = (pIVar2->DC).CursorMaxPos.x;
    fVar26 = (pIVar2->DC).CursorMaxPos.y;
    uVar14 = -(uint)((float)local_138._0_4_ <= fVar27);
    fVar32 = (pIVar2->DC).CursorPos.y;
    uVar25 = -(uint)(fVar32 <= fVar26);
    IVar39.y = (float)(~uVar25 & (uint)fVar32 | (uint)fVar26 & uVar25);
    IVar39.x = (float)(~uVar14 & local_138._0_4_ | (uint)fVar27 & uVar14);
    (pIVar2->DC).CursorMaxPos = IVar39;
    local_1d8.y = local_1f8;
    local_1d8.x = (float)local_188._0_4_;
    InvisibleButton("alpha",(ImVec2 *)&local_1d8);
    if ((GImGui->ActiveId != 0) && (GImGui->ActiveId == (GImGui->CurrentWindow->DC).LastItemId)) {
      fVar26 = ((pIVar22->IO).MousePos.y - local_228.y) / (local_1f8 + -1.0);
      fVar27 = 1.0;
      if (fVar26 <= 1.0) {
        fVar27 = fVar26;
      }
      pIVar18[1].y = (float)(-(uint)(fVar26 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar26 < 0.0) & (uint)(1.0 - fVar27));
      local_234 = 1;
    }
  }
  PopItemFlag();
  pIVar11 = GImGui;
  if ((uVar19 >> 8 & 1) == 0) {
    fVar27 = (pIVar22->Style).ItemInnerSpacing.x;
    pIVar2 = GImGui->CurrentWindow;
    pIVar2->WriteAccessed = true;
    if (pIVar2->SkipItems == false) {
      if (fVar27 < 0.0) {
        fVar27 = (pIVar11->Style).ItemSpacing.x;
      }
      (pIVar2->DC).CursorPos.x = fVar27 + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrentLineHeight = (pIVar2->DC).PrevLineHeight;
      (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    }
    BeginGroup();
  }
  pIVar11 = GImGui;
  if (-1 < (char)uVar19) {
    text_end = local_148;
    if (local_148 != (char *)0xffffffffffffffff) {
      do {
        if (*text_end == '#') {
          if (text_end[1] == '#') goto LAB_00199186;
        }
        else if (*text_end == '\0') goto LAB_00199186;
        text_end = text_end + 1;
      } while (text_end != (char *)0xffffffffffffffff);
      text_end = (char *)0xffffffffffffffff;
    }
LAB_00199186:
    if (text_end != local_148) {
      if ((uVar19 >> 8 & 1) != 0) {
        fVar27 = (pIVar22->Style).ItemInnerSpacing.x;
        pIVar2 = GImGui->CurrentWindow;
        pIVar2->WriteAccessed = true;
        if (pIVar2->SkipItems == false) {
          if (fVar27 < 0.0) {
            fVar27 = (pIVar11->Style).ItemSpacing.x;
          }
          (pIVar2->DC).CursorPos.x = fVar27 + (pIVar2->DC).CursorPosPrevLine.x;
          (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
          (pIVar2->DC).CurrentLineHeight = (pIVar2->DC).PrevLineHeight;
          (pIVar2->DC).CurrentLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
        }
      }
      TextUnformatted(local_148,text_end);
    }
  }
  fVar27 = (float)local_188._0_4_;
  local_13c = uVar24;
  if ((uVar19 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_1d8._0_8_ = *pIVar18;
    if ((uVar19 & 2) == 0) {
      local_1d8.w = pIVar18[1].y;
    }
    else {
      local_1d8.w = 1.0;
    }
    local_1d8.z = pIVar18[1].x;
    if ((char)uVar19 < '\0') {
      Text("Current");
    }
    local_1a8.x = (float)local_188._0_4_ * 3.0;
    local_1a8.y = (float)local_188._0_4_ + (float)local_188._0_4_;
    auVar10._4_8_ = uStack_190;
    auVar10._0_4_ = local_188._4_4_;
    auVar10._12_4_ = 0;
    _local_198 = auVar10 << 0x20;
    ColorButton("##current",&local_1d8,uVar19 & 0xe0040,local_1a8);
    if (IVar23 != (ImVec2)0x0) {
      Text("Original");
      local_120._0_8_ = *(undefined8 *)IVar23;
      local_120._8_4_ = *(float *)((long)IVar23 + 8);
      if ((uVar19 & 2) == 0) {
        fStack_114 = *(float *)((long)IVar23 + 0xc);
      }
      else {
        fStack_114 = 1.0;
      }
      bVar13 = ColorButton("##original",(ImVec4 *)local_120,uVar19 & 0xe0040,local_1a8);
      if (bVar13) {
        memcpy(pIVar18,(void *)IVar23,local_b0);
        local_234 = 1;
      }
    }
    PopItemFlag();
    EndGroup();
    fVar27 = (float)local_188._0_4_;
  }
  if ((local_230 != 0) ||
     (fVar26 = fVar27 * 0.2, fVar32 = 0.0, fVar40 = 0.0, fVar37 = 0.0, local_198[0] != '\0')) {
    local_1a8.y = 0.0;
    local_1a8.x = fVar27 * 0.2;
    fStack_1a0 = 0.0;
    fStack_19c = 0.0;
    ColorConvertHSVtoRGB
              ((float)(~-(uint)(1.0 <= (float)local_158._0_4_) & local_158._0_4_ |
                      (uint)((float)local_158._0_4_ + -1e-05) &
                      -(uint)(1.0 <= (float)local_158._0_4_)),
               (float)(~-(uint)(0.0 < (float)local_f8._0_4_) & 0x3727c5ac |
                      -(uint)(0.0 < (float)local_f8._0_4_) & local_f8._0_4_),
               (float)(~-(uint)(0.0 < (float)local_e8._0_4_) & 0x358637bd |
                      -(uint)(0.0 < (float)local_e8._0_4_) & local_e8._0_4_),&pIVar18->x,&pIVar18->y
               ,&pIVar18[1].x);
    fVar26 = local_1a8.x;
    fVar32 = local_1a8.y;
    fVar40 = fStack_1a0;
    fVar37 = fStack_19c;
  }
  fVar27 = (float)(int)fVar26;
  fVar33 = (float)(int)fVar32;
  fVar30 = (float)(int)fVar40;
  fVar31 = (float)(int)fVar37;
  if ((uVar19 & 0x20) == 0) {
    local_1a8.y = (float)(int)fVar32;
    local_1a8.x = (float)(int)fVar26;
    fVar27 = (float)local_138._0_4_;
    if (local_13c != 0x10000) {
      fVar27 = (float)local_1c8._0_4_;
    }
    fStack_1a0 = (float)(int)fVar40;
    fStack_19c = (float)(int)fVar37;
    PushItemWidth((fVar27 + (float)local_188._0_4_) - local_228.x);
    uVar24 = uVar19 & 0x18e001a;
    if ((uVar19 >> 0x14 & 1) != 0 || (uVar19 & 0x600000) == 0) {
      bVar13 = ColorEdit4("##rgb",&pIVar18->x,uVar24 | 0x100004);
      local_234 = local_234 | bVar13;
    }
    if ((uVar19 >> 0x15 & 1) != 0 || (uVar19 & 0x500000) == 0) {
      bVar13 = ColorEdit4("##hsv",&pIVar18->x,uVar24 | 0x200004);
      local_234 = local_234 | bVar13;
    }
    if ((uVar19 >> 0x16 & 1) != 0 || (uVar19 & 0x300000) == 0) {
      bVar13 = ColorEdit4("##hex",&pIVar18->x,uVar24 | 0x400004);
      local_234 = local_234 | bVar13;
    }
    PopItemWidth();
    fVar27 = local_1a8.x;
    fVar33 = local_1a8.y;
    fVar30 = fStack_1a0;
    fVar31 = fStack_19c;
  }
  local_a8 = (float)(int)fVar27;
  fStack_a4 = (float)(int)fVar33;
  fStack_a0 = (float)(int)fVar30;
  fStack_9c = (float)(int)fVar31;
  if (local_234 == 0) goto LAB_00199638;
  fVar27 = pIVar18->x;
  fVar26 = pIVar18->y;
  fVar32 = pIVar18[1].x;
  fVar40 = fVar26;
  fVar37 = fVar32;
  if (fVar32 <= fVar26) {
    fVar40 = fVar32;
    fVar37 = fVar26;
  }
  fVar33 = (float)(-(uint)(fVar26 < fVar32) & 0xbf800000);
  fVar26 = fVar27;
  fVar32 = fVar37;
  if (fVar37 <= fVar27) {
    fVar26 = fVar37;
    fVar32 = fVar27;
  }
  fVar30 = fVar26;
  if (fVar40 <= fVar26) {
    fVar30 = fVar40;
  }
  if (((fVar26 - fVar40) / ((fVar32 - fVar30) * 6.0 + 1e-20) +
       (float)(-(uint)(fVar27 < fVar37) & (uint)(-0.33333334 - fVar33) |
              ~-(uint)(fVar27 < fVar37) & (uint)fVar33) != 0.0) || ((float)local_158._0_4_ <= 0.0))
  goto LAB_00199638;
  if (0.0 < fVar32) {
LAB_001995fc:
    if (0.0 < (fVar32 - fVar30) / (fVar32 + 1e-20)) goto LAB_00199638;
    fVar27 = (float)local_f8._0_4_ * 0.5;
  }
  else {
    if (((float)local_e8._0_4_ == fVar32) && (!NAN((float)local_e8._0_4_) && !NAN(fVar32)))
    goto LAB_001995fc;
    fVar32 = (float)local_e8._0_4_ * 0.5;
    fVar27 = (float)local_f8._0_4_;
  }
  ColorConvertHSVtoRGB((float)local_158._0_4_,fVar27,fVar32,&pIVar18->x,&pIVar18->y,&pIVar18[1].x);
LAB_00199638:
  local_1d8.x = 1.0;
  local_1d8.y = 1.0;
  local_1d8.z = 1.0;
  local_1d8.w = 1.0;
  ColorConvertHSVtoRGB
            ((float)local_158._0_4_,1.0,1.0,&local_1d8.x,(float *)((long)&local_1d8 + 4),
             (float *)((long)&local_1d8 + 8));
  col_upr_right = ColorConvertFloat4ToU32(&local_1d8);
  local_120._0_8_ = *pIVar18;
  local_120._8_4_ = pIVar18[1].x;
  fStack_114 = 1.0;
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)local_120);
  local_100.x = 0.0;
  local_100.y = 0.0;
  if ((uVar19 >> 0x1a & 1) == 0) {
    if ((uVar19 >> 0x19 & 1) != 0) {
      local_120._0_4_ = local_228.x + local_1f8;
      local_120._4_4_ = local_228.y + local_1f8;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_228,(ImVec2 *)local_120,0xffffffff,col_upr_right,col_upr_right,
                 0xffffffff);
      local_120._0_4_ = local_228.x + local_1f8;
      local_120._4_4_ = local_228.y + local_1f8;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_228,(ImVec2 *)local_120,0,0,0xff000000,0xff000000);
      p_max_01.x = local_228.x + local_1f8;
      p_max_01.y = local_228.y + local_1f8;
      RenderFrameBorder(local_228,p_max_01,0.0);
      fVar27 = 1.0;
      if ((float)local_f8._0_4_ <= 1.0) {
        fVar27 = (float)local_f8._0_4_;
      }
      fVar26 = (float)(int)((float)(~-(uint)((float)local_f8._0_4_ < 0.0) & (uint)fVar27) *
                            local_1f8 + local_228.x + 0.5);
      fVar27 = local_1f8 + local_228.x + -2.0;
      if (fVar26 <= fVar27) {
        fVar27 = fVar26;
      }
      uVar19 = -(uint)(fVar26 < local_228.x + 2.0);
      fVar32 = 1.0 - (float)local_e8._0_4_;
      fVar26 = 1.0;
      if (fVar32 <= 1.0) {
        fVar26 = fVar32;
      }
      fVar32 = (float)(int)((float)(~-(uint)(fVar32 < 0.0) & (uint)fVar26) * local_1f8 + local_228.y
                           + 0.5);
      fVar26 = local_228.y + local_1f8 + -2.0;
      if (fVar32 <= fVar26) {
        fVar26 = fVar32;
      }
      uVar24 = -(uint)(fVar32 < local_228.y + 2.0);
      local_100.y = (float)(uVar24 & (uint)(local_228.y + 2.0) | ~uVar24 & (uint)fVar26);
      local_100.x = (float)(uVar19 & (uint)(local_228.x + 2.0) | ~uVar19 & (uint)fVar27);
      lVar20 = 0;
      local_218._0_4_ = local_1f8 / 6.0;
      do {
        lVar1 = lVar20 + 1;
        local_120._4_4_ = (float)(int)lVar20 * (float)local_218._0_4_ + local_228.y;
        local_120._0_4_ = local_1c8._0_4_;
        local_108.y = (float)(int)lVar1 * (float)local_218._0_4_ + local_228.y;
        local_108.x = (float)local_208._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (this,(ImVec2 *)local_120,&local_108,(&DAT_001daf70)[lVar20],
                   (&DAT_001daf70)[lVar20],(&DAT_001daf74)[lVar20],(&DAT_001daf74)[lVar20]);
        lVar20 = lVar1;
      } while (lVar1 != 6);
      local_218._4_4_ = (float)(int)(float)local_158._4_4_;
      local_218._0_4_ = (float)(int)((float)local_158._0_4_ * local_1f8 + local_228.y + 0.5);
      uStack_210._0_4_ = (uint)(float)(int)fStack_150;
      uStack_210._4_4_ = (uint)(float)(int)fStack_14c;
      p_min.y = local_228.y;
      p_min.x = (float)local_1c8._0_4_;
      p_max_02.y = local_1f8 + local_228.y;
      p_max_02.x = (float)local_208._0_4_;
      RenderFrameBorder(p_min,p_max_02,0.0);
      pos.x = (float)local_1c8._0_4_ + -1.0;
      pos.y = (float)local_218._0_4_;
      half_sz.x = local_a8 + 1.0;
      half_sz.y = local_a8;
      RenderArrowsForVerticalBar(this,pos,half_sz,(float)local_188._0_4_ + 2.0);
      pIVar18 = local_110;
    }
  }
  else {
    local_88._0_4_ = col_upr_right;
    fVar27 = 5.60519e-45;
    if (4 < (int)local_98 / 0xc) {
      fVar27 = (float)((int)local_98 / 0xc);
    }
    local_c8 = ZEXT416((uint)(1.5 / local_98));
    local_68 = -(1.5 / local_98);
    uStack_64 = 0x80000000;
    uStack_60 = 0x80000000;
    uStack_5c = 0x80000000;
    local_98 = local_98 + (float)local_218._0_4_;
    local_1ac = local_98 * 0.5;
    lVar20 = 0;
    local_78 = fVar27;
    do {
      fVar26 = (float)(int)lVar20 / 6.0;
      fVar26 = (fVar26 + fVar26) * 3.1415927 + local_68;
      fVar32 = ((float)(int)lVar20 + 1.0) / 6.0;
      fVar32 = (fVar32 + fVar32) * 3.1415927 + (float)local_c8._0_4_;
      iVar21 = (this->VtxBuffer).Size;
      local_1c8._0_4_ = fVar26;
      local_1a8.x = fVar32;
      ImDrawList::PathArcTo(this,&local_220,local_1ac,fVar26,fVar32,(int)fVar27);
      ImDrawList::AddPolyline
                (this,(this->_Path).Data,(this->_Path).Size,0xffffffff,false,local_1e0._0_4_);
      iVar17 = (this->_Path).Capacity;
      if (iVar17 < 0) {
        uVar19 = iVar17 / 2 + iVar17;
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        __dest = (ImVec2 *)(*GImAllocatorAllocFunc)((ulong)uVar19 * 8,GImAllocatorUserData);
        pIVar18 = (this->_Path).Data;
        if (pIVar18 != (ImVec2 *)0x0) {
          memcpy(__dest,pIVar18,(long)(this->_Path).Size << 3);
          pIVar18 = (this->_Path).Data;
          if (pIVar18 != (ImVec2 *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
        }
        (this->_Path).Data = __dest;
        (this->_Path).Capacity = uVar19;
        fVar27 = local_78;
      }
      (this->_Path).Size = 0;
      iVar17 = (this->VtxBuffer).Size;
      local_208._0_4_ = local_220.x;
      fVar26 = cosf((float)local_1c8._0_4_);
      local_208._4_4_ = extraout_XMM0_Db;
      local_208._0_4_ = fVar26 * (float)local_218._0_4_ + (float)local_208._0_4_;
      uStack_200 = extraout_XMM0_Dc;
      uStack_1fc = extraout_XMM0_Dd;
      local_148._0_4_ = local_220.y;
      fVar26 = sinf((float)local_1c8._0_4_);
      uStack_200 = local_208._4_4_;
      local_208._4_4_ = fVar26 * (float)local_218._0_4_ + local_148._0_4_;
      uStack_1fc = extraout_XMM0_Db_00;
      local_1c8 = ZEXT416((uint)local_220.x);
      fVar26 = cosf(local_1a8.x);
      local_1c8._0_4_ = (float)local_1c8._0_4_ + fVar26 * (float)local_218._0_4_;
      local_148 = (char *)CONCAT44(local_148._4_4_,local_220.y);
      fVar26 = sinf(local_1a8.x);
      gradient_p1.y = fVar26 * (float)local_218._0_4_ + local_148._0_4_;
      gradient_p1.x = (float)local_1c8._0_4_;
      pIVar3 = (this->VtxBuffer).Data;
      lVar1 = lVar20 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar3 + iVar21,pIVar3 + iVar17,(ImVec2)local_208,gradient_p1,
                 (&DAT_001daf70)[lVar20],(&DAT_001daf74)[lVar20]);
      lVar20 = lVar1;
    } while (lVar1 != 6);
    local_158._0_4_ = ((float)local_158._0_4_ + (float)local_158._0_4_) * 3.1415927;
    fVar27 = cosf((float)local_158._0_4_);
    local_218._0_4_ = fVar27;
    fVar27 = sinf((float)local_158._0_4_);
    local_208._0_4_ = fVar27;
    local_120._4_4_ = local_98 * fVar27 * 0.5 + local_220.y;
    local_120._0_4_ = local_98 * (float)local_218._0_4_ * 0.5 + local_220.x;
    if (local_230 == 0) {
      fVar27 = 0.55;
    }
    else {
      fVar27 = 0.65;
    }
    fVar27 = local_1e0._0_4_ * fVar27;
    local_1e0 = (ImGuiContext *)CONCAT44(local_1e0._4_4_,fVar27);
    iVar21 = 0x20;
    if ((int)(fVar27 / 1.4) < 0x20) {
      iVar21 = (int)(fVar27 / 1.4);
    }
    iVar17 = 9;
    if (9 < iVar21) {
      iVar17 = iVar21;
    }
    uVar12 = local_88._0_4_;
    ImDrawList::AddCircleFilled(this,(ImVec2 *)local_120,fVar27,local_88._0_4_,iVar17);
    ImDrawList::AddCircle(this,(ImVec2 *)local_120,local_1e0._0_4_ + 1.0,0xff808080,iVar17,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_120,local_1e0._0_4_,0xffffffff,iVar17,1.0);
    local_108.x = (local_160.x * (float)local_218._0_4_ - (float)local_208._0_4_ * local_160.y) +
                  local_220.x;
    local_108.y = local_160.x * (float)local_208._0_4_ + local_160.y * (float)local_218._0_4_ +
                  local_220.y;
    local_38.x = (local_168.x * (float)local_218._0_4_ - (float)local_208._0_4_ * local_168.y) +
                 local_220.x;
    local_38.y = local_168.x * (float)local_208._0_4_ + local_168.y * (float)local_218._0_4_ +
                 local_220.y;
    local_40.x = (local_170.x * (float)local_218._0_4_ - (float)local_208._0_4_ * local_170.y) +
                 local_220.x;
    local_40.y = local_170.x * (float)local_208._0_4_ + (float)local_218._0_4_ * local_170.y +
                 local_220.y;
    IVar23 = (GImGui->DrawListSharedData).TexUvWhitePixel;
    ImDrawList::PrimReserve(this,6,6);
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)this->_VtxCurrentIdx;
    this->_IdxWritePtr = pIVar4 + 1;
    this->_VtxWritePtr->pos = local_108;
    this->_VtxWritePtr->uv = IVar23;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = uVar12;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar3[1].pos = local_38;
    this->_VtxWritePtr->uv = IVar23;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = uVar12;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar3[1].pos = local_40;
    this->_VtxWritePtr->uv = IVar23;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0xffffffff;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar3[1].pos = local_108;
    this->_VtxWritePtr->uv = IVar23;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar3[1].pos = local_38;
    this->_VtxWritePtr->uv = IVar23;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0xff000000;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar3[1].pos = local_40;
    this->_VtxWritePtr->uv = IVar23;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0;
    this->_VtxWritePtr = pIVar3 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    ImDrawList::AddTriangle(this,&local_108,&local_38,&local_40,0xff808080,1.5);
    fVar27 = 1.0;
    if ((float)local_f8._0_4_ <= 1.0) {
      fVar27 = (float)local_f8._0_4_;
    }
    fVar27 = (float)(~-(uint)((float)local_f8._0_4_ < 0.0) & (uint)fVar27);
    fVar40 = (local_108.x - local_40.x) * fVar27 + local_40.x;
    fVar26 = (local_108.y - local_40.y) * fVar27 + local_40.y;
    fVar32 = 1.0 - (float)local_e8._0_4_;
    fVar27 = 1.0;
    if (fVar32 <= 1.0) {
      fVar27 = fVar32;
    }
    fVar27 = (float)(~-(uint)(fVar32 < 0.0) & (uint)fVar27);
    local_100.x = (local_38.x - fVar40) * fVar27 + fVar40;
    local_100.y = (local_38.y - fVar26) * fVar27 + fVar26;
    pIVar18 = local_110;
  }
  uVar19 = local_13c;
  if (local_198[0] == '\0') {
    fVar27 = 6.0;
  }
  else {
    fVar27 = 10.0;
  }
  local_218._0_4_ = fVar27;
  ImDrawList::AddCircleFilled(this,&local_100,fVar27,col_00,0xc);
  ImDrawList::AddCircle(this,&local_100,(float)local_218._0_4_ + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(this,&local_100,(float)local_218._0_4_,0xffffffff,0xc,1.0);
  if (uVar19 == 0x10000) {
    fVar27 = pIVar18[1].y;
    _local_208 = ZEXT416((uint)fVar27);
    fVar26 = 1.0;
    if (fVar27 <= 1.0) {
      fVar26 = fVar27;
    }
    _local_218 = ZEXT416((uint)(1.0 - fVar26));
    local_120._8_4_ = (float)local_188._0_4_ + (float)local_138._0_4_;
    fStack_114 = local_1f8 + local_228.y;
    local_120._4_4_ = local_228.y;
    local_120._0_4_ = local_138._0_4_;
    p_max.y = fStack_114;
    p_max.x = (float)local_120._8_4_;
    RenderColorRectWithAlphaCheckerboard
              ((ImVec2)local_120._0_8_,p_max,0,
               ((float)local_120._8_4_ - (float)local_138._0_4_) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_120,(ImVec2 *)(local_120 + 8),col_00,col_00,col_00 & 0xffffff,
               col_00 & 0xffffff);
    local_218._4_4_ = (float)(int)(float)(~local_208._4_4_ & local_218._4_4_);
    local_218._0_4_ =
         (float)(int)((float)(-(uint)((float)local_208._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_208._0_4_ < 0.0) & local_218._0_4_) * local_1f8 +
                      local_228.y + 0.5);
    uStack_210._0_4_ = (uint)(float)(int)(float)(~uStack_200 & (uint)uStack_210);
    uStack_210._4_4_ = (uint)(float)(int)(float)(~uStack_1fc & uStack_210._4_4_);
    p_max_00.y = fStack_114;
    p_max_00.x = (float)local_120._8_4_;
    RenderFrameBorder((ImVec2)local_120._0_8_,p_max_00,0.0);
    pos_00.x = (float)local_138._0_4_ + -1.0;
    pos_00.y = (float)local_218._0_4_;
    half_sz_00.x = local_a8 + 1.0;
    half_sz_00.y = local_a8;
    RenderArrowsForVerticalBar(this,pos_00,half_sz_00,(float)local_188._0_4_ + 2.0);
  }
  EndGroup();
  PopID();
  if (local_234 == 0) {
    bVar13 = false;
  }
  else {
    iVar21 = bcmp(local_58,pIVar18,local_b0);
    bVar13 = iVar21 != 0;
  }
  return bVar13;
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImDrawList* draw_list = window->DrawList;

    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(flags, col);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))); // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, CalcItemWidth() - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H,S,V;
    ColorConvertRGBtoHSV(col[0], col[1], col[2], H, S, V);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextUnformatted(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");
        ColorButton("##current", col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
        ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);

    // R,G,B and H,S,V slider color editor
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_RGB || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_RGB);
        if (flags & ImGuiColorEditFlags_HSV || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_HSV);
        if (flags & ImGuiColorEditFlags_HEX || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_HEX);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit), if any
    if (value_changed)
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list->VtxBuffer.Data + vert_start_idx, draw_list->VtxBuffer.Data + vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();
    PopID();

    return value_changed && memcmp(backup_initial_col, col, components * sizeof(float));
}